

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock.cpp
# Opt level: O0

void shim_vkGetDeviceQueue
               (VkDevice device,uint32_t queueFamilyIndex,uint32_t queueIndex,VkQueue *pQueue)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  VkQueue_T *pVVar4;
  __normal_iterator<VkDevice_T_**,_std::vector<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>_>
  local_60;
  VkDevice_T **local_58;
  __normal_iterator<VkDevice_T_**,_std::vector<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>_>
  local_50;
  __normal_iterator<VkDevice_T_**,_std::vector<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>_>
  local_48;
  __normal_iterator<VkDevice_T_**,_std::vector<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>_> it;
  PhysicalDeviceDetails *physical_devices;
  iterator __end1;
  iterator __begin1;
  vector<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>
  *__range1;
  VkQueue *pQueue_local;
  uint32_t queueIndex_local;
  uint32_t queueFamilyIndex_local;
  VkDevice device_local;
  
  _queueIndex_local = device;
  __end1 = std::
           vector<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>
           ::begin(&mock.physical_devices_details);
  physical_devices =
       (PhysicalDeviceDetails *)
       std::
       vector<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>
       ::end(&mock.physical_devices_details);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<VulkanMock::PhysicalDeviceDetails_*,_std::vector<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>_>
                                *)&physical_devices);
    if (!bVar1) {
      return;
    }
    it._M_current =
         (VkDevice_T **)
         __gnu_cxx::
         __normal_iterator<VulkanMock::PhysicalDeviceDetails_*,_std::vector<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>_>
         ::operator*(&__end1);
    local_50._M_current =
         (VkDevice_T **)
         std::begin<std::vector<VkDevice_T*,std::allocator<VkDevice_T*>>>
                   (&((reference)it._M_current)->created_device_handles);
    local_58 = (VkDevice_T **)
               std::end<std::vector<VkDevice_T*,std::allocator<VkDevice_T*>>>
                         ((vector<VkDevice_T_*,_std::allocator<VkDevice_T_*>_> *)
                          (it._M_current + 0xcd));
    local_48 = std::
               find<__gnu_cxx::__normal_iterator<VkDevice_T**,std::vector<VkDevice_T*,std::allocator<VkDevice_T*>>>,VkDevice_T*>
                         (local_50,(__normal_iterator<VkDevice_T_**,_std::vector<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>_>
                                    )local_58,(VkDevice_T **)&queueIndex_local);
    local_60._M_current =
         (VkDevice_T **)
         std::end<std::vector<VkDevice_T*,std::allocator<VkDevice_T*>>>
                   ((vector<VkDevice_T_*,_std::allocator<VkDevice_T_*>_> *)(it._M_current + 0xcd));
    bVar1 = __gnu_cxx::operator!=(&local_48,&local_60);
    if (((bVar1) &&
        (sVar2 = std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::
                 size((vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> *)
                      (it._M_current + 199)), queueFamilyIndex < sVar2)) &&
       (pvVar3 = std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::
                 operator[]((vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                             *)(it._M_current + 199),(ulong)queueFamilyIndex),
       queueIndex < pvVar3->queueCount)) break;
    __gnu_cxx::
    __normal_iterator<VulkanMock::PhysicalDeviceDetails_*,_std::vector<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>_>
    ::operator++(&__end1);
  }
  pVVar4 = get_handle<VkQueue_T*>((ulong)(queueIndex + 0xccee));
  *pQueue = pVVar4;
  return;
}

Assistant:

VKAPI_ATTR void VKAPI_CALL shim_vkGetDeviceQueue(VkDevice device, uint32_t queueFamilyIndex, uint32_t queueIndex, VkQueue* pQueue) {
    for (auto& physical_devices : mock.physical_devices_details) {
        auto it = std::find(
            std::begin(physical_devices.created_device_handles), std::end(physical_devices.created_device_handles), device);
        if (it != std::end(physical_devices.created_device_handles)) {
            if (queueFamilyIndex < physical_devices.queue_family_properties.size() &&
                queueIndex < physical_devices.queue_family_properties[queueFamilyIndex].queueCount) {
                *pQueue = get_handle<VkQueue>(0x0000CCEEU + queueIndex);
                return;
            }
        }
    }
}